

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawList *pIVar2;
  float *pfVar3;
  ImGuiNavMoveResult *pIVar4;
  ImGuiNextWindowData *pIVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImFontAtlas *pIVar8;
  uint *puVar9;
  ImGuiWindow **ppIVar10;
  ImGuiPopupData *pIVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiContext *pIVar14;
  ImGuiID IVar15;
  bool bVar16;
  ImGuiID IVar17;
  ImGuiInputSource IVar18;
  int iVar19;
  ImGuiContext *ctx;
  long lVar20;
  uint *__dest;
  ImGuiWindow *pIVar21;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int i_1;
  int iVar22;
  ImGuiID IVar23;
  ImGuiWindow *window_00;
  char *pcVar24;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar25;
  long lVar26;
  ImGuiDir IVar27;
  ImGuiWindow *window;
  int i_2;
  ImGuiNavMoveResult *pIVar28;
  ImGuiID IVar29;
  float *pfVar30;
  long lVar31;
  ImGuiNavLayer IVar32;
  ImGuiID IVar33;
  ImFont *font;
  float *pfVar34;
  byte bVar35;
  ImGuiContext *g_5;
  ImGuiContext *g_1;
  ImRect *pIVar36;
  ImGuiWindow *old_nav_window;
  bool *pbVar37;
  ulong uVar38;
  ImGuiContext *pIVar39;
  ImGuiContext *g;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  byte bVar43;
  uint uVar44;
  uint uVar45;
  float fVar46;
  ImVec2 IVar47;
  float fVar55;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar51;
  ImVec2 IVar53;
  double dVar52;
  undefined1 auVar54 [16];
  float fVar56;
  float fVar57;
  ImVec2 IVar58;
  ImVec2 IVar59;
  float fVar62;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ImRect local_40;
  
  pIVar12 = GImGui;
  bVar43 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0xe75,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar65 = (GImGui->IO).DeltaTime;
  iVar19 = GImGui->FrameCount;
  if (fVar65 <= 0.0) {
    if (iVar19 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x1a4c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar19 != 0) && (GImGui->FrameCountEnded != iVar19)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a4f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar8->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a50,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a51,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a52,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar56 = (GImGui->Style).Alpha;
  if ((fVar56 < 0.0) || (1.0 < fVar56)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a53,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a54,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a55,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar20 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar20] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x1a57,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1a5b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar12->SettingsLoaded == false) {
    if ((pIVar12->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x2548,"void ImGui::UpdateSettings()");
    }
    pcVar24 = (pIVar12->IO).IniFilename;
    if (pcVar24 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar24);
      fVar65 = (pIVar12->IO).DeltaTime;
    }
    pIVar12->SettingsLoaded = true;
  }
  if ((0.0 < pIVar12->SettingsDirtyTimer) &&
     (fVar56 = pIVar12->SettingsDirtyTimer - fVar65, pIVar12->SettingsDirtyTimer = fVar56,
     fVar56 <= 0.0)) {
    pcVar24 = (pIVar12->IO).IniFilename;
    if (pcVar24 == (char *)0x0) {
      (pIVar12->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar24);
      fVar65 = (pIVar12->IO).DeltaTime;
    }
    pIVar12->SettingsDirtyTimer = 0.0;
  }
  pIVar12->Time = (double)fVar65 + pIVar12->Time;
  pIVar12->WithinFrameScope = true;
  pIVar12->FrameCount = pIVar12->FrameCount + 1;
  pIVar12->TooltipOverrideCount = 0;
  pIVar12->WindowsActiveCount = 0;
  if ((pIVar12->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar9 = (pIVar12->MenusIdSubmittedThisFrame).Data;
    if (puVar9 != (uint *)0x0) {
      memcpy(__dest,puVar9,(long)(pIVar12->MenusIdSubmittedThisFrame).Size << 2);
      puVar9 = (pIVar12->MenusIdSubmittedThisFrame).Data;
      if ((puVar9 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar9,GImAllocatorUserData);
    }
    (pIVar12->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar12->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar65 = (pIVar12->IO).DeltaTime;
  }
  pIVar39 = GImGui;
  (pIVar12->MenusIdSubmittedThisFrame).Size = 0;
  iVar19 = pIVar12->FramerateSecPerFrameIdx;
  pIVar12->FramerateSecPerFrameAccum =
       (fVar65 - pIVar12->FramerateSecPerFrame[iVar19]) + pIVar12->FramerateSecPerFrameAccum;
  pIVar12->FramerateSecPerFrame[iVar19] = fVar65;
  iVar22 = iVar19 + (int)((ulong)((long)(iVar19 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar12->FramerateSecPerFrameIdx = iVar19 + 1 + ((iVar22 >> 6) - (iVar22 >> 0x1f)) * -0x78;
  uVar44 = -(uint)(0.0 < pIVar12->FramerateSecPerFrameAccum);
  (pIVar12->IO).Framerate =
       (float)(~uVar44 & 0x7f7fffff |
              (uint)(1.0 / (pIVar12->FramerateSecPerFrameAccum / 120.0)) & uVar44);
  ((pIVar12->IO).Fonts)->Locked = true;
  font = (pIVar39->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar8 = (pIVar39->IO).Fonts;
    if ((pIVar8->Fonts).Size < 1) {
      pcVar24 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_00154c72:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                    ,0x52a,pcVar24);
    }
    font = *(pIVar8->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar12->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0xe92,"void ImGui::NewFrame()");
  }
  fVar65 = (pIVar12->IO).DisplaySize.x;
  fVar56 = (pIVar12->IO).DisplaySize.y;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.z = fVar65;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.w = fVar56;
  fVar65 = (pIVar12->Style).CircleSegmentMaxError;
  (pIVar12->DrawListSharedData).CurveTessellationTol = (pIVar12->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar12->DrawListSharedData,fVar65);
  bVar40 = (pIVar12->Style).AntiAliasedLines;
  uVar44 = (uint)bVar40;
  (pIVar12->DrawListSharedData).InitialFlags = (uint)bVar40;
  if ((pIVar12->Style).AntiAliasedFill == true) {
    uVar44 = bVar40 | 2;
    (pIVar12->DrawListSharedData).InitialFlags = uVar44;
  }
  if (((pIVar12->IO).BackendFlags & 8) != 0) {
    (pIVar12->DrawListSharedData).InitialFlags = uVar44 | 4;
  }
  pIVar2 = &pIVar12->BackgroundDrawList;
  ImDrawList::Clear(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar12->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  pIVar2 = &pIVar12->ForegroundDrawList;
  ImDrawList::Clear(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar12->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  (pIVar12->DrawData).Valid = false;
  (pIVar12->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar12->DrawData).CmdListsCount = 0;
  (pIVar12->DrawData).TotalIdxCount = 0;
  (pIVar12->DrawData).TotalVtxCount = 0;
  (pIVar12->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar12->DrawData).DisplayPos.y = 0;
  (pIVar12->DrawData).DisplaySize.x = 0.0;
  (pIVar12->DrawData).DisplaySize.y = 0.0;
  (pIVar12->DrawData).FramebufferScale.x = 0.0;
  pIVar39 = GImGui;
  (pIVar12->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar12->DragDropActive == true) &&
     (IVar23 = (pIVar12->DragDropPayload).SourceId, IVar23 == pIVar12->ActiveId)) {
    if (GImGui->ActiveId == IVar23) {
      GImGui->ActiveIdIsAlive = IVar23;
    }
    if (pIVar39->ActiveIdPreviousFrame == IVar23) {
      pIVar39->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar12->HoveredIdPreviousFrame == 0) {
    IVar23 = pIVar12->HoveredId;
    pIVar12->HoveredIdTimer = 0.0;
    pIVar12->HoveredIdNotActiveTimer = 0.0;
    if (IVar23 == 0) goto LAB_0015248a;
LAB_0015245f:
    fVar65 = (pIVar12->IO).DeltaTime;
    pIVar12->HoveredIdTimer = pIVar12->HoveredIdTimer + fVar65;
    IVar17 = IVar23;
    if (pIVar12->ActiveId != IVar23) {
      pIVar12->HoveredIdNotActiveTimer = fVar65 + pIVar12->HoveredIdNotActiveTimer;
      IVar17 = pIVar12->ActiveId;
    }
  }
  else {
    IVar23 = pIVar12->HoveredId;
    if (IVar23 != 0) {
      if (pIVar12->ActiveId == IVar23) {
        pIVar12->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0015245f;
    }
LAB_0015248a:
    IVar23 = 0;
    IVar17 = pIVar12->ActiveId;
  }
  pIVar12->HoveredIdPreviousFrame = IVar23;
  pIVar12->HoveredId = 0;
  pIVar12->HoveredIdAllowOverlap = false;
  if (((pIVar12->ActiveIdIsAlive != IVar17) && (IVar17 != 0)) &&
     (pIVar12->ActiveIdPreviousFrame == IVar17)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar17 = pIVar12->ActiveId;
  }
  fVar65 = (pIVar12->IO).DeltaTime;
  if (IVar17 != 0) {
    pIVar12->ActiveIdTimer = pIVar12->ActiveIdTimer + fVar65;
  }
  pIVar12->LastActiveIdTimer = pIVar12->LastActiveIdTimer + fVar65;
  pIVar12->ActiveIdPreviousFrame = IVar17;
  pIVar12->ActiveIdPreviousFrameWindow = pIVar12->ActiveIdWindow;
  pIVar12->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar12->ActiveIdHasBeenEditedBefore;
  pIVar12->ActiveIdIsAlive = 0;
  pIVar12->ActiveIdHasBeenEditedThisFrame = false;
  pIVar12->ActiveIdPreviousFrameIsAlive = false;
  pIVar12->ActiveIdIsJustActivated = false;
  if (pIVar12->TempInputId == 0) {
LAB_0015257c:
    if (IVar17 == 0) {
      pIVar12->ActiveIdUsingNavDirMask = 0;
      pIVar12->ActiveIdUsingNavInputMask = 0;
      pIVar12->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar17 != pIVar12->TempInputId) {
    pIVar12->TempInputId = 0;
    goto LAB_0015257c;
  }
  pIVar12->DragDropAcceptIdPrev = pIVar12->DragDropAcceptIdCurr;
  pIVar12->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar12->DragDropAcceptIdCurr = 0;
  pIVar12->DragDropWithinSource = false;
  pIVar39 = GImGui;
  pIVar12->DragDropWithinTarget = false;
  bVar40 = (GImGui->IO).KeyCtrl;
  uVar44 = bVar40 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar44 = (uint)bVar40;
  }
  uVar45 = uVar44 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar45 = uVar44;
  }
  uVar44 = uVar45 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar44 = uVar45;
  }
  (pIVar12->IO).KeyMods = uVar44;
  pfVar3 = (pIVar12->IO).KeysDownDuration;
  memcpy((pIVar12->IO).KeysDownDurationPrev,pfVar3,0x800);
  lVar20 = 0;
  do {
    fVar56 = -1.0;
    if ((pIVar12->IO).KeysDown[lVar20] == true) {
      fVar56 = 0.0;
      if (0.0 <= pfVar3[lVar20]) {
        fVar56 = pfVar3[lVar20] + fVar65;
      }
    }
    pfVar3[lVar20] = fVar56;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x200);
  (pIVar39->IO).WantSetMousePos = false;
  uVar44 = (pIVar39->IO).ConfigFlags;
  if (((uVar44 & 2) == 0) || (((pIVar39->IO).BackendFlags & 1) == 0)) {
    bVar35 = 0;
  }
  else if (((0.0 < (pIVar39->IO).NavInputs[0]) || (0.0 < (pIVar39->IO).NavInputs[2])) ||
          ((0.0 < (pIVar39->IO).NavInputs[1] || (bVar35 = 1, 0.0 < (pIVar39->IO).NavInputs[3])))) {
    pIVar39->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar35 = 1;
  }
  if ((uVar44 & 1) != 0) {
    uVar45 = (pIVar39->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar45) {
      if (0x1ff < uVar45) goto LAB_00154c7c;
      if ((pIVar39->IO).KeysDown[(int)uVar45] == true) {
        (pIVar39->IO).NavInputs[0] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar45 = (pIVar39->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar45) {
      if (0x1ff < uVar45) goto LAB_00154c7c;
      if ((pIVar39->IO).KeysDown[(int)uVar45] == true) {
        (pIVar39->IO).NavInputs[2] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar45 = (pIVar39->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar45) {
      if (0x1ff < uVar45) goto LAB_00154c7c;
      if ((pIVar39->IO).KeysDown[(int)uVar45] == true) {
        (pIVar39->IO).NavInputs[1] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar45 = (pIVar39->IO).KeyMap[1];
    if (-1 < (long)(int)uVar45) {
      if (0x1ff < uVar45) goto LAB_00154c7c;
      if ((pIVar39->IO).KeysDown[(int)uVar45] == true) {
        (pIVar39->IO).NavInputs[0x11] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar45 = (pIVar39->IO).KeyMap[2];
    if (-1 < (long)(int)uVar45) {
      if (0x1ff < uVar45) goto LAB_00154c7c;
      if ((pIVar39->IO).KeysDown[(int)uVar45] == true) {
        (pIVar39->IO).NavInputs[0x12] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar45 = (pIVar39->IO).KeyMap[3];
    if (-1 < (long)(int)uVar45) {
      if (0x1ff < uVar45) goto LAB_00154c7c;
      if ((pIVar39->IO).KeysDown[(int)uVar45] == true) {
        (pIVar39->IO).NavInputs[0x13] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar45 = (pIVar39->IO).KeyMap[4];
    if (-1 < (long)(int)uVar45) {
      if (0x1ff < uVar45) {
LAB_00154c7c:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                      ,0x111c,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar39->IO).KeysDown[(int)uVar45] == true) {
        (pIVar39->IO).NavInputs[0x14] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar40 = (pIVar39->IO).KeyCtrl;
    if (bVar40 == true) {
      (pIVar39->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar39->IO).KeyShift == true) {
      (pIVar39->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar40 == false) && ((pIVar39->IO).KeyAlt != false)) {
      (pIVar39->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar3 = (pIVar39->IO).NavInputsDownDuration;
  pfVar30 = pfVar3;
  pfVar34 = (pIVar39->IO).NavInputsDownDurationPrev;
  for (lVar20 = 0x15; lVar20 != 0; lVar20 = lVar20 + -1) {
    *pfVar34 = *pfVar30;
    pfVar30 = pfVar30 + (ulong)bVar43 * -2 + 1;
    pfVar34 = pfVar34 + (ulong)bVar43 * -2 + 1;
  }
  lVar20 = 0;
  do {
    fVar65 = -1.0;
    if (0.0 < (pIVar39->IO).NavInputs[lVar20]) {
      fVar65 = 0.0;
      if (0.0 <= pfVar3[lVar20]) {
        fVar65 = pfVar3[lVar20] + (pIVar39->IO).DeltaTime;
      }
    }
    pfVar3[lVar20] = fVar65;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x15);
  IVar23 = pIVar39->NavInitResultId;
  if ((IVar23 != 0) &&
     (((pIVar39->NavDisableHighlight != true || (pIVar39->NavInitRequestFromMove == true)) &&
      (pIVar39->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar32 = pIVar39->NavLayer;
    if (pIVar39->NavInitRequestFromMove == true) {
      SetNavID(IVar23,IVar32,0);
      IVar47 = (pIVar39->NavInitResultRectRel).Max;
      pIVar6 = &pIVar39->NavWindow->NavRectRel[(int)IVar32].Min;
      *pIVar6 = (pIVar39->NavInitResultRectRel).Min;
      pIVar6[1] = IVar47;
      pIVar39->NavMousePosDirty = true;
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar23,IVar32,0);
    }
    IVar47 = (pIVar39->NavInitResultRectRel).Max;
    pIVar6 = &pIVar39->NavWindow->NavRectRel[pIVar39->NavLayer].Min;
    *pIVar6 = (pIVar39->NavInitResultRectRel).Min;
    pIVar6[1] = IVar47;
  }
  pIVar39->NavInitRequest = false;
  pIVar39->NavInitRequestFromMove = false;
  pIVar39->NavInitResultId = 0;
  pIVar39->NavJustMovedToId = 0;
  pIVar13 = GImGui;
  if (pIVar39->NavMoveRequest == true) {
    IVar23 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar23 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar13->NavDisableHighlight = false;
        pIVar13->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar4 = &GImGui->NavMoveResultOther;
      pIVar28 = &GImGui->NavMoveResultLocal;
      if (IVar23 == 0) {
        pIVar28 = pIVar4;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar23 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar23 != 0)) &&
         (IVar23 != GImGui->NavId)) {
        pIVar28 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar28 == pIVar4) {
LAB_00152a58:
        pIVar28 = pIVar4;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar65 = (GImGui->NavMoveResultOther).DistBox;
        fVar56 = pIVar28->DistBox;
        if (fVar56 <= fVar65) {
          if (((fVar65 != fVar56) || (NAN(fVar65) || NAN(fVar56))) ||
             (pfVar3 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar28->DistCenter < *pfVar3 || pIVar28->DistCenter == *pfVar3)) goto LAB_00152a5b;
        }
        goto LAB_00152a58;
      }
LAB_00152a5b:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar21 = pIVar28->Window, pIVar21 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                      ,0x21f8,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar47 = (pIVar28->RectRel).Min;
          IVar49 = (pIVar28->RectRel).Max;
          fVar65 = (pIVar21->Pos).x;
          local_40.Min.x = IVar47.x + fVar65;
          fVar56 = (pIVar21->Pos).y;
          local_40.Min.y = IVar47.y + fVar56;
          local_40.Max.x = IVar49.x + fVar65;
          local_40.Max.y = IVar49.y + fVar56;
          IVar47 = ScrollToBringRectIntoView(pIVar28->Window,&local_40);
        }
        else {
          fVar65 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar65 = (pIVar21->ScrollMax).y;
          }
          IVar47 = (ImVec2)((ulong)(uint)((pIVar21->Scroll).y - fVar65) << 0x20);
          (pIVar21->ScrollTarget).y = fVar65;
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar65 = (pIVar28->RectRel).Min.y;
        fVar56 = (pIVar28->RectRel).Max.x;
        fVar46 = (pIVar28->RectRel).Max.y;
        (pIVar28->RectRel).Min.x = (pIVar28->RectRel).Min.x - IVar47.x;
        (pIVar28->RectRel).Min.y = fVar65 - IVar47.y;
        (pIVar28->RectRel).Max.x = fVar56 - IVar47.x;
        (pIVar28->RectRel).Max.y = fVar46 - IVar47.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar13->NavWindow = pIVar28->Window;
      IVar23 = pIVar28->ID;
      if (pIVar13->NavId == IVar23) {
        IVar17 = pIVar28->FocusScopeId;
      }
      else {
        pIVar13->NavJustMovedToId = IVar23;
        IVar17 = pIVar28->FocusScopeId;
        pIVar13->NavJustMovedToFocusScopeId = IVar17;
        pIVar13->NavJustMovedToKeyMods = pIVar13->NavMoveRequestKeyMods;
      }
      pIVar14 = GImGui;
      IVar32 = pIVar13->NavLayer;
      SetNavID(IVar23,IVar32,IVar17);
      IVar47 = (pIVar28->RectRel).Max;
      pIVar6 = &pIVar14->NavWindow->NavRectRel[(int)IVar32].Min;
      *pIVar6 = (pIVar28->RectRel).Min;
      pIVar6[1] = IVar47;
      pIVar14->NavMousePosDirty = true;
      pIVar14->NavDisableHighlight = false;
      pIVar14->NavDisableMouseHover = true;
      pIVar13->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar39->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar39->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x2102,"void ImGui::NavUpdate()");
    }
    if (((pIVar39->NavMoveResultLocal).ID == 0) && ((pIVar39->NavMoveResultOther).ID == 0)) {
      pIVar39->NavDisableHighlight = false;
    }
    pIVar39->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar39->NavMousePosDirty == true) && (pIVar39->NavIdIsAlive == true)) {
    if ((((pIVar39->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar39->IO).BackendFlags & 4) != 0 && (pIVar39->NavDisableHighlight == false)) &&
         (pIVar39->NavDisableMouseHover == true)) && (pIVar39->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar47 = NavCalcPreferredRefPos();
      (pIVar39->IO).MousePosPrev = IVar47;
      (pIVar39->IO).MousePos = IVar47;
      (pIVar39->IO).WantSetMousePos = true;
    }
    pIVar39->NavMousePosDirty = false;
  }
  pIVar39->NavIdIsAlive = false;
  pIVar39->NavJustTabbedId = 0;
  IVar32 = pIVar39->NavLayer;
  if (ImGuiNavLayer_Menu < IVar32) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x2118,"void ImGui::NavUpdate()");
  }
  pIVar21 = pIVar39->NavWindow;
  pIVar25 = pIVar21;
  if (pIVar21 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar25->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar25 != pIVar21) {
          pIVar25->NavLastChildNavWindow = pIVar21;
        }
        break;
      }
      ppIVar10 = &pIVar25->ParentWindow;
      pIVar25 = *ppIVar10;
    } while (*ppIVar10 != (ImGuiWindow *)0x0);
    if ((IVar32 == ImGuiNavLayer_Main) && (pIVar21->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar21->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar13 = GImGui;
  pIVar21 = GetTopMostPopupModal();
  if (pIVar21 == (ImGuiWindow *)0x0) {
    if (pIVar13->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar13->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00152d2d;
LAB_00152d4a:
      fVar65 = (pIVar13->IO).NavInputsDownDuration[3];
      if ((((pIVar13->IO).KeyCtrl == true) && (iVar19 = (pIVar13->IO).KeyMap[0], -1 < iVar19)) &&
         (bVar40 = IsKeyPressed(iVar19,true), bVar40)) {
        bVar43 = (byte)(pIVar13->IO).ConfigFlags;
        uVar45 = (uint)bVar43;
        if (fVar65 == 0.0 || (bVar43 & 1) != 0) {
LAB_00152dac:
          pIVar21 = pIVar13->NavWindow;
          if ((pIVar21 != (ImGuiWindow *)0x0) ||
             (pIVar21 = FindWindowNavFocusable
                                  ((pIVar13->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar21 != (ImGuiWindow *)0x0)) {
            pIVar21 = pIVar21->RootWindow;
            pIVar13->NavWindowingTargetAnim = pIVar21;
            pIVar13->NavWindowingTarget = pIVar21;
            pIVar13->NavWindowingTimer = 0.0;
            pIVar13->NavWindowingHighlightAlpha = 0.0;
            pIVar13->NavWindowingToggleLayer = (bool)(~(byte)uVar45 & 1);
            pIVar13->NavInputSource = ImGuiInputSource_NavGamepad - (uVar45 & 1);
          }
        }
      }
      else if ((fVar65 == 0.0) && (!NAN(fVar65))) {
        uVar45 = 0;
        goto LAB_00152dac;
      }
      fVar65 = (pIVar13->IO).DeltaTime + pIVar13->NavWindowingTimer;
      pIVar13->NavWindowingTimer = fVar65;
      if (pIVar13->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00152e43;
LAB_00152fe7:
      bVar40 = false;
      pIVar21 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar65 = (pIVar13->IO).DeltaTime * -10.0 + pIVar13->NavWindowingHighlightAlpha;
        fVar65 = (float)(-(uint)(0.0 <= fVar65) & (uint)fVar65);
        pIVar13->NavWindowingHighlightAlpha = fVar65;
        if ((pIVar13->DimBgRatio <= 0.0) && (fVar65 <= 0.0)) {
          pIVar13->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_00152d4a;
      }
LAB_00152d2d:
      fVar65 = (pIVar13->IO).DeltaTime + pIVar13->NavWindowingTimer;
      pIVar13->NavWindowingTimer = fVar65;
LAB_00152e43:
      IVar18 = pIVar13->NavInputSource;
      if (IVar18 != ImGuiInputSource_NavGamepad) {
LAB_00152f55:
        if (IVar18 == ImGuiInputSource_NavKeyboard) {
          fVar56 = (pIVar13->NavWindowingTimer + -0.2) / 0.05;
          fVar65 = 1.0;
          if (fVar56 <= 1.0) {
            fVar65 = fVar56;
          }
          fVar65 = (float)(~-(uint)(fVar56 < 0.0) & (uint)fVar65);
          uVar45 = -(uint)(fVar65 <= pIVar13->NavWindowingHighlightAlpha);
          pIVar13->NavWindowingHighlightAlpha =
               (float)(uVar45 & (uint)pIVar13->NavWindowingHighlightAlpha | ~uVar45 & (uint)fVar65);
          iVar19 = (GImGui->IO).KeyMap[0];
          if ((-1 < iVar19) && (bVar40 = IsKeyPressed(iVar19,true), bVar40)) {
            NavUpdateWindowingHighlightWindow((pIVar13->IO).KeyShift - 1 | 1);
          }
          if ((pIVar13->IO).KeyCtrl == false) {
            pIVar21 = pIVar13->NavWindowingTarget;
            bVar40 = false;
            goto LAB_00153036;
          }
        }
        goto LAB_00152fe7;
      }
      fVar56 = (fVar65 + -0.2) / 0.05;
      fVar65 = 1.0;
      if (fVar56 <= 1.0) {
        fVar65 = fVar56;
      }
      fVar65 = (float)(~-(uint)(fVar56 < 0.0) & (uint)fVar65);
      uVar45 = -(uint)(fVar65 <= pIVar13->NavWindowingHighlightAlpha);
      fVar65 = (float)(uVar45 & (uint)pIVar13->NavWindowingHighlightAlpha | ~uVar45 & (uint)fVar65);
      pIVar13->NavWindowingHighlightAlpha = fVar65;
      fVar56 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar46 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar19 = (uint)(0.0 < fVar56) - (uint)(0.0 < fVar46);
      if (iVar19 != 0) {
        NavUpdateWindowingHighlightWindow(iVar19);
        pIVar13->NavWindowingHighlightAlpha = 1.0;
        fVar65 = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00152fe7;
        IVar18 = pIVar13->NavInputSource;
        goto LAB_00152f55;
      }
      pbVar37 = &pIVar13->NavWindowingToggleLayer;
      *pbVar37 = (bool)(*pbVar37 & fVar65 < 1.0);
      if (*pbVar37 == false) {
        pIVar21 = pIVar13->NavWindowingTarget;
        bVar40 = false;
      }
      else {
        bVar40 = pIVar13->NavWindow != (ImGuiWindow *)0x0;
        pIVar21 = (ImGuiWindow *)0x0;
      }
      pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_00153036:
    pIVar14 = GImGui;
    fVar65 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar65 == 0.0) && (!NAN(fVar65))) {
      pIVar13->NavWindowingToggleLayer = true;
    }
    if ((((pIVar13->ActiveId == 0) || (pIVar13->ActiveIdAllowOverlap == true)) && (fVar65 < 0.0)) &&
       ((pIVar13->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar14->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar41 = IsMousePosValid(&(pIVar13->IO).MousePos);
      bVar42 = IsMousePosValid(&(pIVar13->IO).MousePosPrev);
      bVar40 = (bool)(bVar42 == bVar41 | bVar40);
    }
    pIVar25 = pIVar13->NavWindowingTarget;
    if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 4) == 0)) {
      IVar18 = pIVar13->NavInputSource;
      if ((IVar18 == ImGuiInputSource_NavGamepad) ||
         ((IVar47.x = 0.0, IVar47.y = 0.0, IVar18 == ImGuiInputSource_NavKeyboard &&
          (IVar18 = ImGuiInputSource_Mouse, (pIVar13->IO).KeyShift == false)))) {
        IVar47 = GetNavInputAmount2d(IVar18,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar65 = IVar47.y;
      if (((IVar47.x != 0.0) || (fVar65 != 0.0)) || (NAN(fVar65))) {
        fVar56 = (pIVar13->IO).DisplayFramebufferScale.x;
        fVar46 = (pIVar13->IO).DisplayFramebufferScale.y;
        if (fVar46 <= fVar56) {
          fVar56 = fVar46;
        }
        fVar56 = (float)(int)(fVar56 * (pIVar13->IO).DeltaTime * 800.0);
        IVar49 = pIVar25->RootWindow->Pos;
        local_40.Min.x = IVar49.x + IVar47.x * fVar56;
        local_40.Min.y = IVar49.y + fVar65 * fVar56;
        SetWindowPos(pIVar25->RootWindow,&local_40.Min,1);
        pIVar13->NavDisableMouseHover = true;
        if (((pIVar13->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar21 != (ImGuiWindow *)0x0) {
      if ((pIVar13->NavWindow == (ImGuiWindow *)0x0) || (pIVar21 != pIVar13->NavWindow->RootWindow))
      {
        SetActiveID(0,(ImGuiWindow *)0x0);
        pIVar13->NavDisableHighlight = false;
        pIVar13->NavDisableMouseHover = true;
        pIVar25 = pIVar21->NavLastChildNavWindow;
        if (pIVar21->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar25 = pIVar21;
        }
        ClosePopupsOverWindow(pIVar25,false);
        FocusWindow(pIVar25);
        if (pIVar25->NavLastIds[0] == 0) {
          NavInitWindow(pIVar25,false);
        }
        if ((pIVar25->DC).NavLayerActiveMask == 2) {
          pIVar13->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar40) && (pIVar21 = pIVar13->NavWindow, pIVar25 = pIVar21, pIVar21 != (ImGuiWindow *)0x0)
       ) {
      while (window_00 = pIVar25, window_00->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar25 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
        break;
      }
      if (window_00 != pIVar21) {
        FocusWindow(window_00);
        window_00->NavLastChildNavWindow = pIVar21;
        pIVar21 = pIVar13->NavWindow;
      }
      pIVar13->NavDisableHighlight = false;
      pIVar13->NavDisableMouseHover = true;
      IVar32 = ImGuiNavLayer_Main;
      if (((pIVar21->DC).NavLayerActiveMask & 2) != 0) {
        IVar32 = pIVar13->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar32);
    }
  }
  else {
    pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar44 & 1) == 0 & (bVar35 ^ 1))) || (pIVar39->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar39->IO).NavActive = false;
LAB_001532e7:
    bVar40 = pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar40 = (pIVar39->NavWindow->Flags & 0x40000U) == 0;
    (pIVar39->IO).NavActive = bVar40;
    if (((!bVar40) || (pIVar39->NavId == 0)) ||
       (bVar40 = true, pIVar39->NavDisableHighlight != false)) goto LAB_001532e7;
  }
  (pIVar39->IO).NavVisible = bVar40;
  fVar65 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar65 == 0.0) && (!NAN(fVar65))) {
    if (pIVar39->ActiveId == 0) {
      pIVar21 = pIVar39->NavWindow;
      if (((pIVar21 == (ImGuiWindow *)0x0) || ((pIVar21->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar21->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar19 = (pIVar39->OpenPopupStack).Size;
        if ((long)iVar19 < 1) {
          if (pIVar39->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar21 != (ImGuiWindow *)0x0) && ((pIVar21->Flags & 0x5000000U) != 0x1000000)) {
              pIVar21->NavLastIds[0] = 0;
            }
            pIVar39->NavId = 0;
            pIVar39->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar39->OpenPopupStack).Data[(long)iVar19 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar19 + -1,true);
        }
      }
      else {
        if (pIVar21->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                        ,0x2134,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar21->ParentWindow);
        pIVar13 = GImGui;
        pIVar25 = GImGui->NavWindow;
        if (pIVar25 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                        ,0x1ef8,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar23 = pIVar21->ChildId;
        GImGui->NavId = IVar23;
        pIVar13->NavFocusScopeId = 0;
        pIVar25->NavLastIds[0] = IVar23;
        pIVar39->NavIdIsAlive = false;
        if (pIVar39->NavDisableMouseHover == true) {
          pIVar39->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar39->NavActivateId = 0;
  pIVar39->NavActivateDownId = 0;
  pIVar39->NavActivatePressedId = 0;
  pIVar13 = GImGui;
  pIVar39->NavInputId = 0;
  IVar23 = pIVar39->NavId;
  IVar17 = 0;
  if ((IVar23 == 0) || (pIVar39->NavDisableHighlight != false)) {
    IVar29 = 0;
LAB_0015346a:
    pIVar21 = pIVar39->NavWindow;
    bVar40 = pIVar21 == (ImGuiWindow *)0x0;
    if ((!bVar40) && ((pIVar21->Flags & 0x40000) != 0)) {
      pIVar39->NavDisableHighlight = true;
    }
    if (IVar17 != IVar29 && IVar29 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x2162,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar29 = 0;
    if (pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0015346a;
    IVar17 = 0;
    if (pIVar39->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar39->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar65 = (GImGui->IO).NavInputsDownDuration[0];
          IVar15 = IVar23;
          if (0.0 <= fVar65) {
            IVar33 = pIVar39->ActiveId;
            if (IVar33 == 0 && fVar65 == 0.0) {
              pIVar39->NavActivateId = IVar23;
              pIVar39->NavActivateDownId = IVar23;
              IVar29 = IVar23;
            }
            else {
              if (IVar33 == 0) {
                pIVar39->NavActivateDownId = IVar23;
              }
              else {
                if (IVar33 != IVar23) goto LAB_001536b7;
                pIVar39->NavActivateDownId = IVar23;
              }
              IVar29 = 0;
              if ((fVar65 != 0.0) || (IVar29 = 0, NAN(fVar65))) goto LAB_00154958;
            }
            pIVar39->NavActivatePressedId = IVar23;
          }
          else {
            IVar33 = pIVar39->ActiveId;
            if ((IVar33 != 0) && (IVar33 != IVar23)) goto LAB_001536b7;
            pIVar39->NavActivateDownId = IVar23;
            IVar29 = 0;
          }
        }
        else {
          IVar33 = pIVar39->ActiveId;
          if (IVar33 == 0) {
            IVar29 = 0;
            IVar15 = 0;
          }
          else {
LAB_001536b7:
            IVar17 = 0;
            IVar29 = 0;
            IVar15 = 0;
            if (IVar33 != IVar23) goto LAB_0015346a;
          }
        }
LAB_00154958:
        IVar17 = IVar15;
        fVar65 = (pIVar13->IO).NavInputsDownDuration[2];
        if ((fVar65 == 0.0) && (!NAN(fVar65))) {
          pIVar39->NavInputId = IVar23;
        }
      }
      goto LAB_0015346a;
    }
    bVar40 = true;
    pIVar21 = (ImGuiWindow *)0x0;
  }
  pIVar39->NavMoveRequest = false;
  IVar23 = pIVar39->NavNextActivateId;
  if (IVar23 != 0) {
    pIVar39->NavActivateId = IVar23;
    pIVar39->NavActivateDownId = IVar23;
    pIVar39->NavActivatePressedId = IVar23;
    pIVar39->NavInputId = IVar23;
  }
  pIVar39->NavNextActivateId = 0;
  if (pIVar39->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar39->NavMoveDir = -1;
    pIVar39->NavMoveRequestFlags = 0;
    IVar27 = -1;
    if (((!bVar40) && (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar21->Flags & 0x40000) == 0)) {
      uVar45 = GImGui->ActiveIdUsingNavDirMask;
      IVar27 = -1;
      if (((uVar45 & 1) == 0) &&
         ((fVar65 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar65 ||
          (fVar65 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar65)))) {
        pIVar39->NavMoveDir = 0;
        IVar27 = 0;
      }
      if (((uVar45 & 2) == 0) &&
         ((fVar65 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar65 ||
          (fVar65 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar65)))) {
        pIVar39->NavMoveDir = 1;
        IVar27 = 1;
      }
      if (((uVar45 & 4) == 0) &&
         ((fVar65 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar65 ||
          (fVar65 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar65)))) {
        pIVar39->NavMoveDir = 2;
        IVar27 = 2;
      }
      if (((uVar45 & 8) == 0) &&
         ((fVar65 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar65 ||
          (fVar65 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar65)))) {
        pIVar39->NavMoveDir = 3;
        IVar27 = 3;
      }
    }
    pIVar39->NavMoveClipDir = IVar27;
  }
  else {
    if ((pIVar39->NavMoveDir == -1) || (pIVar39->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x217d,"void ImGui::NavUpdate()");
    }
    if (pIVar39->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x217e,"void ImGui::NavUpdate()");
    }
    pIVar39->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar13 = GImGui;
  fVar65 = 0.0;
  if ((((((uVar44 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar21 = GImGui->NavWindow, pIVar21 != (ImGuiWindow *)0x0)) &&
      (((pIVar21->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar40 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar42 = false;
    bVar41 = false;
    if (bVar40) {
      bVar41 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar40 = IsKeyDown((pIVar13->IO).KeyMap[6]);
    if (bVar40) {
      bVar42 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar40 = IsKeyPressed((pIVar13->IO).KeyMap[7],true);
    if (bVar40) {
      bVar40 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar40 = false;
    }
    bVar16 = IsKeyPressed((pIVar13->IO).KeyMap[8],true);
    if (bVar16) {
      bVar16 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar16 = false;
    }
    fVar65 = 0.0;
    if ((bVar41 != bVar42) || (bVar40 != bVar16)) {
      if (((pIVar21->DC).NavLayerActiveMask == 0) && ((pIVar21->DC).NavHasScroll == true)) {
        bVar41 = IsKeyPressed((pIVar13->IO).KeyMap[5],true);
        if (bVar41) {
          (pIVar21->ScrollTarget).y =
               (pIVar21->Scroll).y - ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y);
LAB_00154c0a:
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar41 = IsKeyPressed((pIVar13->IO).KeyMap[6],true);
          if (bVar41) {
            fVar65 = ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y) + (pIVar21->Scroll).y
            ;
LAB_00154c03:
            (pIVar21->ScrollTarget).y = fVar65;
            goto LAB_00154c0a;
          }
          if (bVar40 == false) {
            if (bVar16 != false) {
              fVar65 = (pIVar21->ScrollMax).y;
              goto LAB_00154c03;
            }
          }
          else {
            (pIVar21->ScrollTarget).y = 0.0;
            (pIVar21->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_00154c13:
        fVar65 = 0.0;
      }
      else {
        IVar32 = pIVar13->NavLayer;
        pIVar36 = pIVar21->NavRectRel + IVar32;
        fVar65 = GImGui->FontBaseSize * pIVar21->FontWindowScale;
        if (pIVar21->ParentWindow != (ImGuiWindow *)0x0) {
          fVar65 = fVar65 * pIVar21->ParentWindow->FontWindowScale;
        }
        fVar65 = (pIVar21->NavRectRel[IVar32].Max.y - pIVar21->NavRectRel[IVar32].Min.y) +
                 (((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y) - fVar65);
        fVar65 = (float)(~-(uint)(fVar65 <= 0.0) & (uint)fVar65);
        bVar41 = IsKeyPressed((pIVar13->IO).KeyMap[5],true);
        if (bVar41) {
          fVar65 = -fVar65;
          pIVar13->NavMoveDir = 3;
          pIVar13->NavMoveClipDir = 2;
          pIVar13->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar41 = IsKeyPressed((pIVar13->IO).KeyMap[6],true);
          if (bVar41) {
            pIVar13->NavMoveDir = 2;
            pIVar13->NavMoveClipDir = 3;
            pIVar13->NavMoveRequestFlags = 0x30;
          }
          else {
            if (bVar40 != false) {
              fVar65 = -(pIVar21->Scroll).y;
              pIVar21->NavRectRel[IVar32].Max.y = fVar65;
              pIVar21->NavRectRel[IVar32].Min.y = fVar65;
              fVar65 = (pIVar36->Min).x;
              pIVar6 = &pIVar21->NavRectRel[IVar32].Max;
              if (pIVar6->x <= fVar65 && fVar65 != pIVar6->x) {
                pIVar21->NavRectRel[IVar32].Max.x = 0.0;
                (pIVar36->Min).x = 0.0;
              }
              pIVar13->NavMoveDir = 3;
              pIVar13->NavMoveRequestFlags = 0x50;
              goto LAB_00154c13;
            }
            fVar65 = 0.0;
            if (bVar16 != false) {
              fVar56 = ((pIVar21->ScrollMax).y + (pIVar21->SizeFull).y) - (pIVar21->Scroll).y;
              pIVar21->NavRectRel[IVar32].Max.y = fVar56;
              pIVar21->NavRectRel[IVar32].Min.y = fVar56;
              fVar56 = (pIVar36->Min).x;
              pIVar6 = &pIVar21->NavRectRel[IVar32].Max;
              if (pIVar6->x <= fVar56 && fVar56 != pIVar6->x) {
                pIVar21->NavRectRel[IVar32].Max.x = 0.0;
                (pIVar36->Min).x = 0.0;
              }
              pIVar13->NavMoveDir = 2;
              pIVar13->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  uVar44 = pIVar39->NavMoveDir;
  if (uVar44 == 0xffffffff) {
    bVar43 = pIVar39->NavMoveRequest;
    if ((bVar43 & 1) != 0) goto LAB_00153762;
    bVar40 = false;
  }
  else {
    pIVar39->NavMoveRequest = true;
    pIVar39->NavMoveRequestKeyMods = (pIVar39->IO).KeyMods;
    pIVar39->NavMoveDirLast = uVar44;
    bVar43 = 1;
LAB_00153762:
    bVar40 = true;
    if (pIVar39->NavId == 0) {
      pIVar39->NavInitRequest = true;
      pIVar39->NavInitRequestFromMove = true;
      pIVar39->NavInitResultId = 0;
      pIVar39->NavDisableHighlight = false;
    }
  }
  pIVar13 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar37 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar37;
    if (*pbVar37 != false) goto LAB_00153873;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00153873:
    if (pIVar13->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x206c,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar21 = pIVar39->NavWindow;
  if (((pIVar21 != (ImGuiWindow *)0x0) && ((pIVar21->Flags & 0x40000) == 0)) &&
     (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar56 = pIVar13->FontBaseSize * pIVar21->FontWindowScale;
    if (pIVar21->ParentWindow != (ImGuiWindow *)0x0) {
      fVar56 = fVar56 * pIVar21->ParentWindow->FontWindowScale;
    }
    fVar56 = (float)(int)(fVar56 * 100.0 * (pIVar39->IO).DeltaTime + 0.5);
    if (((pIVar21->DC).NavLayerActiveMask == 0) && ((bVar43 & (pIVar21->DC).NavHasScroll) == 1)) {
      if (uVar44 < 2) {
        lVar20 = 0x6c;
        lVar26 = 100;
        uVar45 = 0;
        lVar31 = 0x54;
      }
      else {
        if ((uVar44 & 0xfffffffe) != 2) goto LAB_0015396d;
        lVar20 = 0x70;
        lVar26 = 0x68;
        uVar45 = 2;
        lVar31 = 0x58;
      }
      *(float *)((long)&pIVar21->Name + lVar26) =
           (float)(int)(*(float *)(&DAT_00196a50 + (ulong)(uVar44 == uVar45) * 4) * fVar56 +
                       *(float *)((long)&pIVar21->Name + lVar31));
      *(undefined4 *)((long)&pIVar21->Name + lVar20) = 0;
    }
LAB_0015396d:
    IVar47 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar46 = IVar47.x;
    fVar55 = IVar47.y;
    if (((fVar46 != 0.0) || (NAN(fVar46))) && (pIVar21->ScrollbarX == true)) {
      (pIVar21->ScrollTarget).x = (float)(int)(fVar46 * fVar56 + (pIVar21->Scroll).x);
      (pIVar21->ScrollTargetCenterRatio).x = 0.0;
      pIVar39->NavMoveFromClampedRefRect = true;
    }
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      (pIVar21->ScrollTarget).y = (float)(int)(fVar55 * fVar56 + (pIVar21->Scroll).y);
      (pIVar21->ScrollTargetCenterRatio).y = 0.0;
      pIVar39->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar39->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultLocal).ID = 0;
  (pIVar39->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar39->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar39->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar39->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar39->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultOther).ID = 0;
  (pIVar39->NavMoveResultOther).FocusScopeId = 0;
  (pIVar39->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar40) && (pIVar39->NavMoveFromClampedRefRect == true)) &&
     (pIVar39->NavLayer == ImGuiNavLayer_Main)) {
    IVar47 = (pIVar21->InnerRect).Min;
    fVar56 = (pIVar21->Pos).x;
    fVar55 = (pIVar21->Pos).y;
    fVar57 = (IVar47.x - fVar56) + -1.0;
    fVar62 = (IVar47.y - fVar55) + -1.0;
    IVar47 = (pIVar21->InnerRect).Max;
    fVar46 = (IVar47.x - fVar56) + 1.0;
    fVar55 = (IVar47.y - fVar55) + 1.0;
    fVar56 = pIVar21->NavRectRel[0].Min.x;
    if (((fVar56 < fVar57) || (pIVar21->NavRectRel[0].Min.y < fVar62)) ||
       ((fVar46 < pIVar21->NavRectRel[0].Max.x || (fVar55 < pIVar21->NavRectRel[0].Max.y)))) {
      fVar66 = pIVar13->FontBaseSize * pIVar21->FontWindowScale;
      if (pIVar21->ParentWindow != (ImGuiWindow *)0x0) {
        fVar66 = fVar66 * pIVar21->ParentWindow->FontWindowScale;
      }
      auVar67._0_4_ = fVar66 * 0.5;
      auVar68._0_4_ = fVar46 - fVar57;
      auVar68._4_4_ = fVar55 - fVar62;
      auVar68._8_8_ = 0;
      auVar67._4_4_ = auVar67._0_4_;
      auVar67._8_4_ = auVar67._0_4_;
      auVar67._12_4_ = auVar67._0_4_;
      auVar69 = minps(auVar68,auVar67);
      fVar57 = fVar57 + auVar69._0_4_;
      fVar62 = fVar62 + auVar69._4_4_;
      fVar66 = pIVar21->NavRectRel[0].Min.y;
      uVar44 = -(uint)(fVar57 <= fVar56);
      uVar45 = -(uint)(fVar62 <= fVar66);
      auVar60._0_4_ = fVar46 - auVar69._0_4_;
      auVar60._4_4_ = fVar55 - auVar69._4_4_;
      auVar60._8_4_ = 0.0 - auVar69._8_4_;
      auVar60._12_4_ = 0.0 - auVar69._12_4_;
      auVar69._8_8_ = 0;
      auVar69._0_4_ = pIVar21->NavRectRel[0].Max.x;
      auVar69._4_4_ = pIVar21->NavRectRel[0].Max.y;
      auVar60 = minps(auVar69,auVar60);
      pIVar21->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar45 & (uint)fVar62,~uVar44 & (uint)fVar57) |
                   CONCAT44((uint)fVar66 & uVar45,(uint)fVar56 & uVar44));
      pIVar21->NavRectRel[0].Max = auVar60._0_8_;
      pIVar39->NavId = 0;
      pIVar39->NavFocusScopeId = 0;
      pIVar21 = pIVar39->NavWindow;
    }
    pIVar39->NavMoveFromClampedRefRect = false;
  }
  if (pIVar21 == (ImGuiWindow *)0x0) {
    IVar49 = (pIVar13->IO).DisplaySize;
    fVar56 = 0.0;
    fVar46 = 0.0;
  }
  else {
    IVar47 = pIVar21->NavRectRel[pIVar39->NavLayer].Min;
    IVar49 = pIVar21->NavRectRel[pIVar39->NavLayer].Max;
    IVar48.x = 0.0;
    IVar48.y = 0.0;
    IVar58.x = 0.0;
    IVar58.y = 0.0;
    if (IVar47.y <= IVar49.y && IVar47.x <= IVar49.x) {
      IVar48 = IVar49;
      IVar58 = IVar47;
    }
    fVar55 = (pIVar21->Pos).x;
    fVar56 = IVar58.x + fVar55;
    fVar57 = (pIVar21->Pos).y;
    fVar46 = IVar58.y + fVar57;
    IVar49.x = IVar48.x + fVar55;
    IVar49.y = IVar48.y + fVar57;
  }
  (pIVar39->NavScoringRect).Min.y = fVar46 + fVar65;
  fVar57 = IVar49.y + fVar65;
  (pIVar39->NavScoringRect).Max.y = fVar57;
  fVar55 = fVar56 + 1.0;
  if (IVar49.x <= fVar56 + 1.0) {
    fVar55 = IVar49.x;
  }
  (pIVar39->NavScoringRect).Min.x = fVar55;
  (pIVar39->NavScoringRect).Max.x = fVar55;
  if (fVar57 < fVar46 + fVar65) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x21d0,"void ImGui::NavUpdate()");
  }
  pIVar39->NavScoringCount = 0;
  pIVar6 = &(pIVar13->IO).MousePos;
  bVar40 = IsMousePosValid(pIVar6);
  if (bVar40) {
    IVar47 = (pIVar13->IO).MousePos;
    IVar50.x = (float)(int)IVar47.x;
    IVar50.y = (float)(int)IVar47.y;
    pIVar13->LastValidMousePos = IVar50;
    (pIVar13->IO).MousePos = IVar50;
  }
  bVar40 = IsMousePosValid(pIVar6);
  if ((bVar40) && (bVar40 = IsMousePosValid(&(pIVar13->IO).MousePosPrev), bVar40)) {
    IVar47 = (pIVar13->IO).MousePos;
    IVar49 = (pIVar13->IO).MousePosPrev;
    IVar51.x = IVar47.x - IVar49.x;
    IVar51.y = IVar47.y - IVar49.y;
    (pIVar13->IO).MouseDelta = IVar51;
    if ((((IVar51.x != 0.0) || (NAN(IVar51.x))) || (IVar51.y != 0.0)) || (NAN(IVar51.y))) {
      pIVar13->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar13->IO).MouseDelta.x = 0.0;
    (pIVar13->IO).MouseDelta.y = 0.0;
  }
  (pIVar13->IO).MousePosPrev = (pIVar13->IO).MousePos;
  lVar20 = 0;
  do {
    if ((pIVar13->IO).MouseDown[lVar20] == true) {
      fVar65 = (pIVar13->IO).MouseDownDuration[lVar20];
      pbVar37 = (pIVar13->IO).MouseClicked + lVar20;
      *pbVar37 = fVar65 < 0.0;
      pbVar37[10] = false;
      (pIVar13->IO).MouseDownDurationPrev[lVar20] = fVar65;
      if (0.0 <= fVar65) {
        (pIVar13->IO).MouseDownDuration[lVar20] = fVar65 + (pIVar13->IO).DeltaTime;
        (pIVar13->IO).MouseDoubleClicked[lVar20] = false;
        bVar40 = IsMousePosValid(pIVar6);
        auVar54 = ZEXT816(0);
        if (bVar40) {
          IVar47 = (pIVar13->IO).MousePos;
          IVar49 = (pIVar13->IO).MouseClickedPos[lVar20];
          auVar54._0_4_ = IVar47.x - IVar49.x;
          auVar54._4_4_ = IVar47.y - IVar49.y;
          auVar54._8_8_ = 0;
        }
        fVar65 = (pIVar13->IO).MouseDragMaxDistanceSqr[lVar20];
        fVar56 = auVar54._0_4_ * auVar54._0_4_ + auVar54._4_4_ * auVar54._4_4_;
        uVar44 = -(uint)(fVar56 <= fVar65);
        (pIVar13->IO).MouseDragMaxDistanceSqr[lVar20] =
             (float)(~uVar44 & (uint)fVar56 | (uint)fVar65 & uVar44);
        IVar47 = (pIVar13->IO).MouseDragMaxDistanceAbs[lVar20];
        auVar63._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
        auVar63._8_4_ = auVar54._8_4_ ^ 0x80000000;
        auVar63._12_4_ = auVar54._12_4_ ^ 0x80000000;
        auVar60 = maxps(auVar63,auVar54);
        fVar65 = IVar47.x;
        fVar56 = IVar47.y;
        uVar44 = -(uint)(auVar60._0_4_ <= fVar65);
        uVar45 = -(uint)(auVar60._4_4_ <= fVar56);
        pIVar7 = (pIVar13->IO).MouseDragMaxDistanceAbs + lVar20;
        pIVar7->x = (float)(~uVar44 & (uint)auVar60._0_4_ | (uint)fVar65 & uVar44);
        pIVar7->y = (float)(~uVar45 & (uint)auVar60._4_4_ | (uint)fVar56 & uVar45);
      }
      else {
        (pIVar13->IO).MouseDownDuration[lVar20] = 0.0;
        (pIVar13->IO).MouseDoubleClicked[lVar20] = false;
        dVar52 = pIVar13->Time;
        if ((float)(dVar52 - (pIVar13->IO).MouseClickedTime[lVar20]) <
            (pIVar13->IO).MouseDoubleClickTime) {
          bVar40 = IsMousePosValid(pIVar6);
          fVar65 = 0.0;
          fVar56 = 0.0;
          if (bVar40) {
            IVar47 = (pIVar13->IO).MousePos;
            IVar49 = (pIVar13->IO).MouseClickedPos[lVar20];
            fVar65 = IVar47.x - IVar49.x;
            fVar56 = IVar47.y - IVar49.y;
          }
          fVar46 = (pIVar13->IO).MouseDoubleClickMaxDist;
          dVar52 = -1.79769313486232e+308;
          if (fVar65 * fVar65 + fVar56 * fVar56 < fVar46 * fVar46) {
            (pIVar13->IO).MouseDoubleClicked[lVar20] = true;
            dVar52 = -1.79769313486232e+308;
          }
        }
        (pIVar13->IO).MouseClickedTime[lVar20] = dVar52;
        (pIVar13->IO).MouseClickedPos[lVar20] = (pIVar13->IO).MousePos;
        (pIVar13->IO).MouseDownWasDoubleClick[lVar20] = (pIVar13->IO).MouseDoubleClicked[lVar20];
        pIVar7 = (pIVar13->IO).MouseDragMaxDistanceAbs + lVar20;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar13->IO).MouseDragMaxDistanceSqr[lVar20] = 0.0;
      }
    }
    else {
      (pIVar13->IO).MouseClicked[lVar20] = false;
      fVar65 = (pIVar13->IO).MouseDownDuration[lVar20];
      (pIVar13->IO).MouseReleased[lVar20] = 0.0 <= fVar65;
      pbVar37 = (pIVar13->IO).MouseClicked + lVar20;
      (pIVar13->IO).MouseDownDurationPrev[lVar20] = fVar65;
      (pIVar13->IO).MouseDownDuration[lVar20] = -1.0;
      (pIVar13->IO).MouseDoubleClicked[lVar20] = false;
    }
    if (((pIVar13->IO).MouseDown[lVar20] == false) && ((pIVar13->IO).MouseReleased[lVar20] == false)
       ) {
      (pIVar13->IO).MouseDownWasDoubleClick[lVar20] = false;
    }
    if (*pbVar37 == true) {
      pIVar13->NavDisableMouseHover = false;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar21 = GetTopMostPopupModal();
  if ((pIVar21 != (ImGuiWindow *)0x0) ||
     ((pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar12->NavWindowingHighlightAlpha)))) {
    fVar65 = (pIVar12->IO).DeltaTime * 6.0 + pIVar12->DimBgRatio;
    if (1.0 <= fVar65) {
      fVar65 = 1.0;
    }
    pIVar12->DimBgRatio = fVar65;
  }
  else {
    fVar65 = (pIVar12->IO).DeltaTime * -10.0 + pIVar12->DimBgRatio;
    pIVar12->DimBgRatio = (float)(-(uint)(0.0 <= fVar65) & (uint)fVar65);
  }
  pIVar12->MouseCursor = 0;
  pIVar12->WantTextInputNextFrame = -1;
  pIVar12->WantCaptureMouseNextFrame = -1;
  pIVar12->WantCaptureKeyboardNextFrame = -1;
  (pIVar12->PlatformImePos).x = 1.0;
  pIVar39 = GImGui;
  (pIVar12->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar40 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar40) &&
        (fVar65 = (pIVar39->IO).MouseDragThreshold,
        fVar56 = (pIVar39->IO).MousePos.x - (pIVar39->WheelingWindowRefMousePos).x,
        fVar46 = (pIVar39->IO).MousePos.y - (pIVar39->WheelingWindowRefMousePos).y,
        fVar65 * fVar65 < fVar56 * fVar56 + fVar46 * fVar46)) ||
       (pIVar39->WheelingWindowTimer <= 0.0)) {
      pIVar39->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar39->WheelingWindowTimer = 0.0;
    }
  }
  pIVar13 = GImGui;
  fVar65 = (pIVar39->IO).MouseWheel;
  if (((((fVar65 != 0.0) || (fVar56 = (pIVar39->IO).MouseWheelH, fVar56 != 0.0)) || (NAN(fVar56)))
      && ((pIVar21 = pIVar39->WheelingWindow, pIVar21 != (ImGuiWindow *)0x0 ||
          (pIVar21 = pIVar39->HoveredWindow, pIVar21 != (ImGuiWindow *)0x0)))) &&
     (pIVar21->Collapsed == false)) {
    if ((fVar65 != 0.0) || (NAN(fVar65))) {
      if ((pIVar39->IO).KeyCtrl == true) {
        if ((pIVar39->IO).FontAllowUserScaling == true) {
          if (GImGui->WheelingWindow != pIVar21) {
            GImGui->WheelingWindow = pIVar21;
            pIVar13->WheelingWindowRefMousePos = (pIVar13->IO).MousePos;
            pIVar13->WheelingWindowTimer = 2.0;
            fVar65 = (pIVar39->IO).MouseWheel;
          }
          fVar56 = pIVar21->FontWindowScale;
          fVar46 = fVar65 * 0.1 + fVar56;
          fVar65 = 2.5;
          if (fVar46 <= 2.5) {
            fVar65 = fVar46;
          }
          fVar65 = (float)(-(uint)(fVar46 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar46 < 0.5) & (uint)fVar65);
          pIVar21->FontWindowScale = fVar65;
          if ((pIVar21->Flags & 0x1000000) == 0) {
            fVar65 = fVar65 / fVar56;
            IVar47 = pIVar21->Size;
            auVar61._8_8_ = 0;
            auVar61._0_4_ = IVar47.x;
            auVar61._4_4_ = IVar47.y;
            IVar49 = (pIVar39->IO).MousePos;
            fVar56 = (pIVar21->Pos).x;
            fVar46 = (pIVar21->Pos).y;
            auVar64._0_4_ = (IVar49.x - fVar56) * (1.0 - fVar65) * IVar47.x;
            auVar64._4_4_ = (IVar49.y - fVar46) * (1.0 - fVar65) * IVar47.y;
            auVar64._8_8_ = 0;
            auVar60 = divps(auVar64,auVar61);
            local_40.Min.x = auVar60._0_4_ + fVar56;
            local_40.Min.y = auVar60._4_4_ + fVar46;
            SetWindowPos(pIVar21,&local_40.Min,0);
            IVar53.x = (float)(int)((pIVar21->Size).x * fVar65);
            IVar53.y = (float)(int)((pIVar21->Size).y * fVar65);
            IVar59.x = (float)(int)((pIVar21->SizeFull).x * fVar65);
            IVar59.y = (float)(int)((pIVar21->SizeFull).y * fVar65);
            pIVar21->Size = IVar53;
            pIVar21->SizeFull = IVar59;
          }
          goto LAB_001540f9;
        }
      }
      else if ((pIVar39->IO).KeyShift == false) {
        if (GImGui->WheelingWindow != pIVar21) {
          GImGui->WheelingWindow = pIVar21;
          pIVar13->WheelingWindowRefMousePos = (pIVar13->IO).MousePos;
          pIVar13->WheelingWindowTimer = 2.0;
        }
        uVar44 = pIVar21->Flags;
        while (((uVar44 >> 0x18 & 1) != 0 &&
               (((uVar44 & 0x210) == 0x10 ||
                ((fVar56 = (pIVar21->ScrollMax).y, fVar56 == 0.0 && (!NAN(fVar56)))))))) {
          pIVar21 = pIVar21->ParentWindow;
          uVar44 = pIVar21->Flags;
        }
        if ((uVar44 & 0x210) == 0) {
          fVar56 = ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y) * 0.67;
          fVar46 = pIVar13->FontBaseSize * pIVar21->FontWindowScale;
          if (pIVar21->ParentWindow != (ImGuiWindow *)0x0) {
            fVar46 = fVar46 * pIVar21->ParentWindow->FontWindowScale;
          }
          fVar55 = fVar46 * 5.0;
          if (fVar56 <= fVar46 * 5.0) {
            fVar55 = fVar56;
          }
          (pIVar21->ScrollTarget).y = (pIVar21->Scroll).y - fVar65 * (float)(int)fVar55;
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    pIVar13 = GImGui;
    fVar65 = (pIVar39->IO).MouseWheelH;
    if (((fVar65 == 0.0) && (!NAN(fVar65))) || ((pIVar39->IO).KeyShift == true)) {
      fVar65 = (pIVar39->IO).MouseWheel;
      if (((fVar65 == 0.0) && (!NAN(fVar65))) || ((pIVar39->IO).KeyShift != true))
      goto LAB_001540f9;
    }
    if ((pIVar39->IO).KeyCtrl == false) {
      if (GImGui->WheelingWindow != pIVar21) {
        GImGui->WheelingWindow = pIVar21;
        pIVar13->WheelingWindowRefMousePos = (pIVar13->IO).MousePos;
        pIVar13->WheelingWindowTimer = 2.0;
      }
      uVar44 = pIVar21->Flags;
      while (((uVar44 >> 0x18 & 1) != 0 &&
             (((uVar44 & 0x210) == 0x10 ||
              ((fVar56 = (pIVar21->ScrollMax).x, fVar56 == 0.0 && (!NAN(fVar56)))))))) {
        pIVar21 = pIVar21->ParentWindow;
        uVar44 = pIVar21->Flags;
      }
      if ((uVar44 & 0x210) == 0) {
        fVar56 = ((pIVar21->InnerRect).Max.x - (pIVar21->InnerRect).Min.x) * 0.67;
        fVar46 = pIVar13->FontBaseSize * pIVar21->FontWindowScale;
        if (pIVar21->ParentWindow != (ImGuiWindow *)0x0) {
          fVar46 = fVar46 * pIVar21->ParentWindow->FontWindowScale;
        }
        fVar55 = fVar46 + fVar46;
        if (fVar56 <= fVar46 + fVar46) {
          fVar55 = fVar56;
        }
        (pIVar21->ScrollTarget).x = (pIVar21->Scroll).x - fVar65 * (float)(int)fVar55;
        (pIVar21->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_001540f9:
  pIVar39 = GImGui;
  pIVar21 = GImGui->NavWindow;
  if ((((pIVar21 == (ImGuiWindow *)0x0) || (pIVar21->Active != true)) ||
      ((pIVar21->Flags & 0x40000) != 0)) ||
     (((GImGui->IO).KeyCtrl != false || (iVar19 = (GImGui->IO).KeyMap[0], iVar19 < 0)))) {
    GImGui->FocusTabPressed = false;
  }
  else {
    bVar40 = IsKeyPressed(iVar19,true);
    pIVar39->FocusTabPressed = bVar40;
    if ((bVar40) && (pIVar39->ActiveId == 0)) {
      pIVar21 = pIVar39->NavWindow;
      pIVar39->FocusRequestNextWindow = pIVar21;
      pIVar39->FocusRequestNextCounterRegular = 0x7fffffff;
      if ((pIVar39->NavId == 0) || (pIVar39->NavIdTabCounter == 0x7fffffff)) {
        iVar19 = -(uint)(pIVar39->IO).KeyShift;
      }
      else {
        iVar19 = pIVar39->NavIdTabCounter + (-(uint)(pIVar39->IO).KeyShift | 1) + 1;
      }
      pIVar39->FocusRequestNextCounterTabStop = iVar19;
      goto LAB_00154193;
    }
  }
  pIVar21 = pIVar39->FocusRequestNextWindow;
LAB_00154193:
  pIVar39->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar39->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar39->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar21 != (ImGuiWindow *)0x0) {
    pIVar39->FocusRequestCurrWindow = pIVar21;
    if ((pIVar39->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar19 = (pIVar21->DC).FocusCounterRegular, iVar19 != -1)) {
      pIVar39->FocusRequestCurrCounterRegular =
           (pIVar39->FocusRequestNextCounterRegular + iVar19 + 1) % (iVar19 + 1);
    }
    if ((pIVar39->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar19 = (pIVar21->DC).FocusCounterTabStop, iVar19 != -1)) {
      pIVar39->FocusRequestCurrCounterTabStop =
           (pIVar39->FocusRequestNextCounterTabStop + iVar19 + 1) % (iVar19 + 1);
    }
    pIVar39->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar39->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar39->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar39->NavIdTabCounter = 0x7fffffff;
  uVar44 = (pIVar12->WindowsFocusOrder).Size;
  if (uVar44 != (pIVar12->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0xefc,"void ImGui::NewFrame()");
  }
  fVar65 = (pIVar12->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar65) {
    fVar65 = (float)pIVar12->Time - fVar65;
  }
  else {
    fVar65 = 3.4028235e+38;
  }
  if (uVar44 != 0) {
    uVar38 = 0;
    do {
      if ((long)(int)uVar44 <= (long)uVar38) {
        pcVar24 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00154c72;
      }
      pIVar21 = (pIVar12->Windows).Data[uVar38];
      bVar40 = pIVar21->Active;
      pIVar21->WasActive = bVar40;
      pIVar21->BeginCount = 0;
      pIVar21->Active = false;
      pIVar21->WriteAccessed = false;
      if (((bVar40 == false) && (pIVar21->MemoryCompacted == false)) &&
         (pIVar21->LastTimeActive <= fVar65 && fVar65 != pIVar21->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar21);
        uVar44 = (pIVar12->Windows).Size;
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar44);
  }
  if ((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (pIVar12->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar12->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar10 = (pIVar12->CurrentWindowStack).Data;
    if (ppIVar10 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar10,(long)(pIVar12->CurrentWindowStack).Size << 3);
      ppIVar10 = (pIVar12->CurrentWindowStack).Data;
      if ((ppIVar10 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
    }
    (pIVar12->CurrentWindowStack).Data = __dest_00;
    (pIVar12->CurrentWindowStack).Capacity = 0;
  }
  (pIVar12->CurrentWindowStack).Size = 0;
  if ((pIVar12->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar11 = (pIVar12->BeginPopupStack).Data;
    if (pIVar11 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar11,(long)(pIVar12->BeginPopupStack).Size * 0x30);
      pIVar11 = (pIVar12->BeginPopupStack).Data;
      if ((pIVar11 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
    }
    (pIVar12->BeginPopupStack).Data = __dest_01;
    (pIVar12->BeginPopupStack).Capacity = 0;
  }
  (pIVar12->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar12->NavWindow,false);
  pIVar39 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar39->DebugItemPickerActive == true) {
    uVar44 = pIVar39->HoveredIdPreviousFrame;
    pIVar39->MouseCursor = 7;
    iVar19 = (pIVar39->IO).KeyMap[0xe];
    if ((-1 < iVar19) && (bVar40 = IsKeyPressed(iVar19,true), bVar40)) {
      pIVar39->DebugItemPickerActive = false;
    }
    pIVar13 = GImGui;
    fVar65 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar65 != 0.0) || (NAN(fVar65))) {
      uVar45 = (uint)(uVar44 == 0);
    }
    else if (uVar44 == 0) {
      uVar45 = 1;
    }
    else {
      pIVar39->DebugItemPickerBreakId = uVar44;
      pIVar39->DebugItemPickerActive = false;
      uVar45 = 0;
    }
    pIVar5 = &pIVar13->NextWindowData;
    *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
    (pIVar13->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar44);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar45 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar39 = GImGui;
  }
  pIVar12->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar39->NextWindowData).Flags = (byte)(pIVar39->NextWindowData).Flags | 2;
  (pIVar39->NextWindowData).SizeVal.x = 400.0;
  (pIVar39->NextWindowData).SizeVal.y = 400.0;
  (pIVar39->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar12->CurrentWindow->IsFallbackWindow != false) {
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                ,0xf1e,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}